

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_pipeline_int8_x86(ConvolutionDepthWise_x86 *this,Option *opt)

{
  ulong uVar1;
  int iVar2;
  long in_RSI;
  long *in_RDI;
  Mat weight_data_r2;
  int elempack;
  int channels;
  int maxk;
  Option *in_stack_000005f8;
  ConvolutionDepthWise_x86 *in_stack_00000600;
  Option *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  Mat *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  Mat *in_stack_ffffffffffffffb8;
  int local_24;
  
  uVar1 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) /
          (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
  iVar2 = ((int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                (long)(*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8))) /
          (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108))) *
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
  if ((iVar2 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108)) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) ==
      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0))) {
    local_24 = 1;
    if (((*(byte *)(in_RSI + 0x27) & 1) != 0) && (local_24 = 1, iVar2 % 8 == 0)) {
      local_24 = 8;
    }
    if (local_24 == 8) {
      ncnn::Mat::reshape(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                         in_stack_ffffffffffffffb0,(Allocator *)in_stack_ffffffffffffffa8);
      convert_packing((Mat *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98)
      ;
      ncnn::Mat::~Mat((Mat *)0x60ceaf);
    }
  }
  else {
    create_group_ops(in_stack_00000600,in_stack_000005f8);
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            elempack = channels % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__

        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_int8, 8, opt);
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    return 0;
}